

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O3

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe29At2(uint8_t *buf)

{
  return (ulong)((*(ushort *)(buf + 2) & 0x7fff) << 0xe | (uint)buf[1] << 6 | (uint)(*buf >> 2));
}

Assistant:

std::uint64_t readFlUIntLe29At2(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 6;
    res |= (buf[0] >> 2);
    res &= UINT64_C(0x1fffffff);
    return res;
}